

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

void __thiscall database::Container::Container(Container *this,Container *container)

{
  pointer pvVar1;
  pointer this_00;
  size_type __n;
  iterator __first;
  iterator __last;
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  local_30 [3];
  Container *local_18;
  Container *container_local;
  Container *this_local;
  
  local_18 = container;
  container_local = this;
  std::__cxx11::string::string((string *)&this->m_name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
  ::map(&this->m_schema);
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>,std::default_delete<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>,void>
            ((unique_ptr<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>,std::default_delete<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>>
              *)&this->m_data);
  this->m_id = local_18->m_id;
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_18->m_name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
  ::operator=(&this->m_schema,&local_18->m_schema);
  std::
  make_unique<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>
            ();
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::operator=(&this->m_data,local_30);
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::~unique_ptr(local_30);
  pvVar1 = std::
           unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
           ::operator->(&this->m_data);
  this_00 = std::
            unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
            ::operator->(&local_18->m_data);
  __n = std::
        vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
        ::size(this_00);
  std::
  vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
  ::reserve(pvVar1,__n);
  pvVar1 = std::
           unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
           ::operator->(&local_18->m_data);
  __first = std::
            vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
            ::begin(pvVar1);
  pvVar1 = std::
           unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
           ::operator->(&local_18->m_data);
  __last = std::
           vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
           ::end(pvVar1);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>*,std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>,database::Container::Container(database::Container_const&)::_lambda(auto:1)_1_>
            ((__normal_iterator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_*,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_*,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
              )__last._M_current,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

Container(const database::Container& container)
    {
      this -> m_id = container.m_id;
      this -> m_name = container.m_name;
      this -> m_schema = container.m_schema;

      this -> m_data = std::make_unique<database::impl_storage_type>();
      this -> m_data -> reserve(container.m_data -> size());
      std::for_each(container.m_data -> begin(),container.m_data -> end(),[&](auto column){
        std::vector<database::ComparableString> buffer;
        buffer.reserve(column.size());
        std::for_each(column.begin(),column.end(),[&](auto data) {
          buffer.emplace_back(data);
        });
        this -> m_data -> emplace_back(buffer);
      });
    }